

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O1

void __thiscall
SuiteFieldMapTests::TesthasGroup_groupExists::RunImpl(TesthasGroup_groupExists *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  FieldMap group;
  FieldMap fieldMap;
  bool local_10a;
  bool local_109;
  message_order local_108;
  message_order local_e8 [3];
  FieldMap local_78 [112];
  
  local_e8[0].m_mode = normal;
  local_e8[0]._4_8_ = 0;
  local_e8[0].m_groupOrder._4_8_ = 0;
  local_e8[0]._20_8_ = 0;
  FIX::FieldMap::FieldMap(local_78,local_e8);
  FIX::shared_array<int>::release(&local_e8[0].m_groupOrder);
  local_108.m_mode = normal;
  local_108._4_8_ = 0;
  local_108.m_groupOrder._4_8_ = 0;
  local_108._20_8_ = 0;
  FIX::FieldMap::FieldMap((FieldMap *)local_e8,&local_108);
  FIX::shared_array<int>::release(&local_108.m_groupOrder);
  FIX::FieldMap::addGroup((int)local_78,(FieldMap *)0x1,SUB81(local_e8,0));
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_109 = true;
  local_10a = (bool)FIX::FieldMap::hasGroup((int)local_78);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_108,*ppTVar2,0x5d);
  UnitTest::CheckEqual<bool,bool>(results,&local_109,&local_10a,(TestDetails *)&local_108);
  FIX::FieldMap::~FieldMap((FieldMap *)local_e8);
  FIX::FieldMap::~FieldMap(local_78);
  return;
}

Assistant:

TEST(hasGroup_groupExists)
{
  FieldMap fieldMap;
  FieldMap group;
  fieldMap.addGroup(1, group);

  CHECK_EQUAL(true, fieldMap.hasGroup(1));
}